

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

deUint32 __thiscall
sglr::ReferenceContext::checkFramebufferStatus(ReferenceContext *this,deUint32 target)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  ChannelOrder CVar5;
  deUint32 dVar6;
  Texture *pTVar7;
  ulong uVar8;
  Renderbuffer *pRVar9;
  TestError *this_00;
  long lVar10;
  long lVar11;
  byte bVar12;
  byte bVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  int local_70;
  int local_6c;
  ConstPixelBufferAccess local_58;
  
  if ((target - 0x8ca8 < 2) || (target == 0x8d40)) {
    lVar10 = 0x3f40;
    if (target != 0x8d40) {
      lVar10 = (ulong)(target == 0x8ca9) * 8 + 0x3f38;
    }
    lVar10 = *(long *)((long)(this->m_defaultColorbuffer).m_access.super_ConstPixelBufferAccess.
                             m_size.m_data + lVar10 + -0x70);
    if (lVar10 == 0) {
      dVar6 = 0x8cd5;
    }
    else {
      bVar15 = true;
      bVar16 = true;
      local_6c = -1;
      lVar14 = 0;
      local_70 = -1;
      bVar4 = false;
      bVar12 = 1;
      bVar13 = 1;
      do {
        iVar1 = *(int *)(lVar10 + 0x10 + lVar14);
        if (iVar1 == 0) {
          pRVar9 = rc::ObjectManager<sglr::rc::Renderbuffer>::find
                             (&this->m_renderbuffers,*(deUint32 *)(lVar10 + 0x14 + lVar14));
          if (pRVar9 == (Renderbuffer *)0x0) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,(char *)0x0,"renderbuffer",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                       ,0x8bd);
            goto LAB_018e1a0d;
          }
          iVar1 = (pRVar9->m_data).m_size.m_data[0];
          iVar3 = (pRVar9->m_data).m_size.m_data[1];
          CVar5 = (pRVar9->m_data).m_format.order;
LAB_018e181e:
          if (((iVar3 < 1) || (iVar1 < 1)) || (bVar4)) {
            bVar13 = bVar12;
            if (iVar3 != local_70 || iVar1 != local_6c) {
              bVar12 = 0;
              bVar13 = 0;
            }
          }
          else {
            bVar4 = true;
            local_70 = iVar3;
            local_6c = iVar1;
          }
          bVar16 = bVar15;
          switch(CVar5) {
          case R:
          case RG:
          case RGB:
          case RGBA:
          case sRGB:
          case sRGBA:
            bVar17 = lVar14 == 0;
            break;
          default:
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Unsupported attachment channel order",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                       ,0x8f0);
LAB_018e1a0d:
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          case D:
            bVar17 = lVar14 == 0x14;
            break;
          case S:
            bVar17 = lVar14 == 0x28;
            break;
          case DS:
            if (lVar14 == 0) {
              bVar16 = false;
              bVar15 = bVar16;
            }
            goto LAB_018e1876;
          }
          if (!bVar17) {
            bVar16 = false;
            bVar15 = false;
          }
        }
        else if (iVar1 != 2) {
          if (iVar1 != 1) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,(char *)0x0,"attachment.type == Framebuffer::ATTACHMENTTYPE_LAST",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                       ,0x8c5);
            goto LAB_018e1a0d;
          }
          pTVar7 = rc::ObjectManager<sglr::rc::Texture>::find
                             (&this->m_textures,*(deUint32 *)(lVar10 + 0x14 + lVar14));
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_58);
          if (pTVar7 == (Texture *)0x0) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,(char *)0x0,"texture",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                       ,0x885);
            goto LAB_018e1a0d;
          }
          uVar2 = *(uint *)(lVar10 + 0x18 + lVar14);
          if (uVar2 == 0) {
LAB_018e1723:
            uVar8 = (ulong)*(uint *)(lVar10 + 0x1c + lVar14);
            if (uVar8 < 0xe) {
              lVar11._0_4_ = (&pTVar7[1].super_NamedObject)[uVar8].m_name;
              lVar11._4_4_ = (&pTVar7[1].super_NamedObject)[uVar8].m_refCount;
joined_r0x018e173f:
              if (lVar11 != 0) {
                local_58.m_data =
                     *(void **)((long)&pTVar7[3].m_sampler.borderColor + uVar8 * 0x28 + 4);
                local_58.m_format = *(TextureFormat *)(&pTVar7[3].m_sampler.wrapR + uVar8 * 10);
                local_58.m_size.m_data._0_8_ =
                     *(undefined8 *)(&pTVar7[3].m_sampler.magFilter + uVar8 * 10);
                local_58._16_8_ =
                     *(undefined8 *)(&pTVar7[3].m_sampler.normalizedCoords + uVar8 * 0x28);
                local_58.m_pitch.m_data._4_8_ =
                     *(undefined8 *)(&pTVar7[3].m_sampler.compareChannel + uVar8 * 10);
              }
            }
          }
          else {
            if (6 < uVar2) {
              if (((uVar2 != 9) && (uVar2 != 8)) && (uVar2 != 7)) {
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,"Framebuffer attached to a texture but no valid target specified"
                           ,(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                           ,0x8b4);
                goto LAB_018e1a0d;
              }
              goto LAB_018e1723;
            }
            bVar16 = true;
            switch(uVar2) {
            case 1:
              lVar11 = 1;
              break;
            case 2:
              lVar11 = 3;
              break;
            case 3:
              lVar11 = 5;
              break;
            case 4:
              lVar11 = 0;
              break;
            case 5:
              lVar11 = 2;
              break;
            case 6:
              lVar11 = 4;
              break;
            default:
              lVar11 = 6;
              bVar16 = false;
            }
            if (!bVar16) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,(char *)0x0,"de::inBounds<int>(face, 0, tcu::CUBEFACE_LAST)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                         ,0x896);
              goto LAB_018e1a0d;
            }
            uVar8 = (ulong)*(uint *)(lVar10 + 0x1c + lVar14);
            if (uVar8 < 0xe) {
              pTVar7 = pTVar7 + lVar11 * 0xe;
              lVar11._0_4_ = (&pTVar7[1].super_NamedObject)[uVar8].m_name;
              lVar11._4_4_ = (&pTVar7[1].super_NamedObject)[uVar8].m_refCount;
              goto joined_r0x018e173f;
            }
          }
          CVar5 = local_58.m_format.order;
          iVar1 = local_58.m_size.m_data[0];
          iVar3 = local_58.m_size.m_data[1];
          goto LAB_018e181e;
        }
LAB_018e1876:
        lVar14 = lVar14 + 0x14;
      } while (lVar14 != 0x3c);
      dVar6 = 0x8cd6;
      if ((bVar16) && (dVar6 = 0x8cd7, bVar4)) {
        dVar6 = ((byte)~bVar13 & 1) * 4 + 0x8cd5;
      }
    }
  }
  else {
    dVar6 = 0;
    if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
      dVar6 = 0;
    }
  }
  return dVar6;
}

Assistant:

deUint32 ReferenceContext::checkFramebufferStatus (deUint32 target)
{
	RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
				target != GL_DRAW_FRAMEBUFFER	&&
				target != GL_READ_FRAMEBUFFER, GL_INVALID_ENUM, 0);

	// Select binding point.
	rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;

	// Default framebuffer is always complete.
	if (!framebufferBinding)
		return GL_FRAMEBUFFER_COMPLETE;

	int		width				= -1;
	int		height				= -1;
	bool	hasAttachment		= false;
	bool	attachmentComplete	= true;
	bool	dimensionsOk		= true;

	for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
	{
		const Framebuffer::Attachment&	attachment			= framebufferBinding->getAttachment((Framebuffer::AttachmentPoint)point);
		int								attachmentWidth		= 0;
		int								attachmentHeight	= 0;
		tcu::TextureFormat				attachmentFormat;

		if (attachment.type == Framebuffer::ATTACHMENTTYPE_TEXTURE)
		{
			const Texture*					texture	= m_textures.find(attachment.name);
			tcu::ConstPixelBufferAccess		level;
			TCU_CHECK(texture);

			if (attachment.texTarget == Framebuffer::TEXTARGET_2D)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_2D);
				const Texture2D* tex2D = static_cast<const Texture2D*>(texture);

				if (tex2D->hasLevel(attachment.level))
					level = tex2D->getLevel(attachment.level);
			}
			else if (deInRange32(attachment.texTarget, Framebuffer::TEXTARGET_CUBE_MAP_POSITIVE_X,
													   Framebuffer::TEXTARGET_CUBE_MAP_NEGATIVE_Z))
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_CUBE_MAP);

				const TextureCube*	texCube	= static_cast<const TextureCube*>(texture);
				const tcu::CubeFace	face	= texTargetToFace(attachment.texTarget);
				TCU_CHECK(de::inBounds<int>(face, 0, tcu::CUBEFACE_LAST));

				if (texCube->hasFace(attachment.level, face))
					level = texCube->getFace(attachment.level, face);
			}
			else if (attachment.texTarget == Framebuffer::TEXTARGET_2D_ARRAY)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_2D_ARRAY);
				const Texture2DArray* tex2DArr = static_cast<const Texture2DArray*>(texture);

				if (tex2DArr->hasLevel(attachment.level))
					level = tex2DArr->getLevel(attachment.level); // \note Slice doesn't matter here.
			}
			else if (attachment.texTarget == Framebuffer::TEXTARGET_3D)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_3D);
				const Texture3D* tex3D = static_cast<const Texture3D*>(texture);

				if (tex3D->hasLevel(attachment.level))
					level = tex3D->getLevel(attachment.level); // \note Slice doesn't matter here.
			}
			else if (attachment.texTarget == Framebuffer::TEXTARGET_CUBE_MAP_ARRAY)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_CUBE_MAP_ARRAY);
				const TextureCubeArray* texCubeArr = static_cast<const TextureCubeArray*>(texture);

				if (texCubeArr->hasLevel(attachment.level))
					level = texCubeArr->getLevel(attachment.level); // \note Slice doesn't matter here.
			}
			else
				TCU_FAIL("Framebuffer attached to a texture but no valid target specified");

			attachmentWidth		= level.getWidth();
			attachmentHeight	= level.getHeight();
			attachmentFormat	= level.getFormat();
		}
		else if (attachment.type == Framebuffer::ATTACHMENTTYPE_RENDERBUFFER)
		{
			const Renderbuffer* renderbuffer = m_renderbuffers.find(attachment.name);
			TCU_CHECK(renderbuffer);

			attachmentWidth		= renderbuffer->getWidth();
			attachmentHeight	= renderbuffer->getHeight();
			attachmentFormat	= renderbuffer->getFormat();
		}
		else
		{
			TCU_CHECK(attachment.type == Framebuffer::ATTACHMENTTYPE_LAST);
			continue; // Skip rest of checks.
		}

		if (!hasAttachment && attachmentWidth > 0 && attachmentHeight > 0)
		{
			width			= attachmentWidth;
			height			= attachmentHeight;
			hasAttachment	= true;
		}
		else if (attachmentWidth != width || attachmentHeight != height)
			dimensionsOk = false;

		// Validate attachment point compatibility.
		switch (attachmentFormat.order)
		{
			case TextureFormat::R:
			case TextureFormat::RG:
			case TextureFormat::RGB:
			case TextureFormat::RGBA:
			case TextureFormat::sRGB:
			case TextureFormat::sRGBA:
				if (point != Framebuffer::ATTACHMENTPOINT_COLOR0)
					attachmentComplete = false;
				break;

			case TextureFormat::D:
				if (point != Framebuffer::ATTACHMENTPOINT_DEPTH)
					attachmentComplete = false;
				break;

			case TextureFormat::S:
				if (point != Framebuffer::ATTACHMENTPOINT_STENCIL)
					attachmentComplete = false;
				break;

			case TextureFormat::DS:
				if (point != Framebuffer::ATTACHMENTPOINT_DEPTH &&
					point != Framebuffer::ATTACHMENTPOINT_STENCIL)
					attachmentComplete = false;
				break;

			default:
				TCU_FAIL("Unsupported attachment channel order");
		}
	}

	if (!attachmentComplete)
		return GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT;
	else if (!hasAttachment)
		return GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT;
	else if (!dimensionsOk)
		return GL_FRAMEBUFFER_INCOMPLETE_DIMENSIONS;
	else
		return GL_FRAMEBUFFER_COMPLETE;
}